

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.h
# Opt level: O1

void __thiscall
disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BlockingStrategy,_0>::
~Sequencer(Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BlockingStrategy,_0> *this)

{
  pointer ppSVar1;
  pointer plVar2;
  
  ppSVar1 = (this->gating_sequences_).
            super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1);
  }
  std::condition_variable::~condition_variable(&(this->wait_strategy_).consumer_notify_condition_);
  plVar2 = (this->ring_buffer_).events_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2);
    return;
  }
  return;
}

Assistant:

Sequencer(size_t n) : ring_buffer_(n), claim_strategy_(n) {}